

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool walkModelAndPipeline
               (Model *model,function<bool_(const_CoreML::Specification::Model_&)> *handler)

{
  uint32_t uVar1;
  int iVar2;
  StringVector *pSVar3;
  Model *pMVar4;
  Rep *pRVar5;
  bool bVar6;
  undefined1 *puVar7;
  InternalMetadata *pIVar8;
  void **ppvVar9;
  long lVar10;
  function<bool_(const_CoreML::Specification::Model_&)> local_90;
  function<bool_(const_CoreML::Specification::Model_&)> local_70;
  function<bool_(const_CoreML::Specification::Model_&)> local_50;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    puVar7 = (undefined1 *)((model->Type_).pipelineclassifier_)->pipeline_;
    if ((Pipeline *)puVar7 == (Pipeline *)0x0) {
      puVar7 = CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar5 = (((Pipeline *)puVar7)->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar5->elements;
    if (pRVar5 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar2 = (((Pipeline *)puVar7)->models_).super_RepeatedPtrFieldBase.current_size_;
    lVar10 = 0;
    do {
      if ((long)iVar2 * 8 == lVar10) goto LAB_0025bea6;
      pMVar4 = *(Model **)((long)ppvVar9 + lVar10);
      std::function<bool_(const_CoreML::Specification::Model_&)>::function(&local_90,handler);
      bVar6 = walkModelAndPipeline(pMVar4,&local_90);
      std::_Function_base::~_Function_base(&local_90.super__Function_base);
      lVar10 = lVar10 + 8;
    } while (!bVar6);
  }
  else if (uVar1 == 0xc9) {
    puVar7 = (undefined1 *)((model->Type_).pipelineclassifier_)->pipeline_;
    if ((Pipeline *)puVar7 == (Pipeline *)0x0) {
      puVar7 = CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar5 = (((Pipeline *)puVar7)->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar5->elements;
    if (pRVar5 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar2 = (((Pipeline *)puVar7)->models_).super_RepeatedPtrFieldBase.current_size_;
    lVar10 = 0;
    do {
      if ((long)iVar2 * 8 == lVar10) goto LAB_0025bea6;
      pMVar4 = *(Model **)((long)ppvVar9 + lVar10);
      std::function<bool_(const_CoreML::Specification::Model_&)>::function(&local_70,handler);
      bVar6 = walkModelAndPipeline(pMVar4,&local_70);
      std::_Function_base::~_Function_base(&local_70.super__Function_base);
      lVar10 = lVar10 + 8;
    } while (!bVar6);
  }
  else {
    if (uVar1 != 0xca) {
LAB_0025bea6:
      bVar6 = std::function<bool_(const_CoreML::Specification::Model_&)>::operator()(handler,model);
      return bVar6;
    }
    pSVar3 = (((model->Type_).treeensembleclassifier_)->ClassLabels_).stringclasslabels_;
    pIVar8 = &(pSVar3->super_MessageLite)._internal_metadata_;
    if (pSVar3 == (StringVector *)0x0) {
      pIVar8 = (InternalMetadata *)0x0;
    }
    iVar2 = ((model->Type_).treeensembleclassifier_)->postevaluationtransform_;
    lVar10 = 0;
    do {
      if ((long)iVar2 * 8 == lVar10) goto LAB_0025bea6;
      pMVar4 = *(Model **)((long)&pIVar8->ptr_ + lVar10);
      std::function<bool_(const_CoreML::Specification::Model_&)>::function(&local_50,handler);
      bVar6 = walkModelAndPipeline(pMVar4,&local_50);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      lVar10 = lVar10 + 8;
    } while (!bVar6);
  }
  return true;
}

Assistant:

static bool walkModelAndPipeline(const Specification::Model &model,
                                 std::function<bool(const Specification::Model& m)> handler) {
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        default:
            break;
    }
    if (handler(model)) {
        return true;
    }
    return false;
}